

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O0

int connect_server(http_t *info)

{
  int iVar1;
  int iVar2;
  unsigned_long uVar3;
  unsigned_short port;
  unsigned_long addr;
  undefined4 local_28;
  sockaddr_in server;
  int sockfd;
  http_t *info_local;
  
  iVar2 = info->port;
  unique0x100001a0 = info;
  server.sin_zero._0_4_ = socket(2,1,0);
  if (server.sin_zero._0_4_ == -1) {
    if ((print_level & 4U) != 0) {
      printf("[%s][%s(%d)]:socket create failed\n","MSG_ERROR","connect_server",0xb0);
    }
    close(server.sin_zero._0_4_);
    info_local._4_4_ = -1;
  }
  else {
    iVar1 = set_socket_option(server.sin_zero._0_4_);
    if (iVar1 == -1) {
      close(server.sin_zero._0_4_);
      info_local._4_4_ = -1;
    }
    else {
      uVar3 = dns(stack0xffffffffffffffe8->host_name);
      if (uVar3 == 0xffffffffffffffff) {
        if ((print_level & 4U) != 0) {
          printf("[%s][%s(%d)]:Get Dns Failed\n","MSG_ERROR","connect_server",0xbb);
        }
        close(server.sin_zero._0_4_);
        info_local._4_4_ = -1;
      }
      else {
        memset((void *)((long)&addr + 4),0,0x10);
        addr._4_2_ = 2;
        addr._6_2_ = htons((uint16_t)iVar2);
        local_28 = (undefined4)uVar3;
        iVar2 = connect(server.sin_zero._0_4_,(sockaddr *)((long)&addr + 4),0x10);
        if (iVar2 == -1) {
          if ((print_level & 4U) != 0) {
            printf("[%s][%s(%d)]:connect failed: %m\n","MSG_ERROR","connect_server",0xc6);
          }
          close(server.sin_zero._0_4_);
          info_local._4_4_ = -1;
        }
        else {
          stack0xffffffffffffffe8->sock = server.sin_zero._0_4_;
          info_local._4_4_ = 0;
        }
      }
    }
  }
  return info_local._4_4_;
}

Assistant:

int connect_server(http_t *info) {
  int sockfd;
  struct sockaddr_in server;
  unsigned long addr = 0;
  unsigned short port = info->port;

  sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if (-1 == sockfd) {
    lprintf(MSG_ERROR, "socket create failed\n");
    close(sockfd);
    return -1;
  }

  if (-1 == set_socket_option(sockfd)) {
    close(sockfd);
    return -1;
  }

  if ((addr = dns(info->host_name)) == -1) {
    lprintf(MSG_ERROR, "Get Dns Failed\n");
    close(sockfd);
    return -1;
  }
  memset(&server, 0, sizeof(server));
  server.sin_family = AF_INET;
  server.sin_port = htons(port);
  server.sin_addr.s_addr = addr;

  if (-1 ==
      connect(sockfd, (struct sockaddr *)&server, sizeof(struct sockaddr))) {
    lprintf(MSG_ERROR, "connect failed: %m\n");
    close(sockfd);
    return -1;
  }

  info->sock = sockfd;
  return 0;
}